

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrGLContext.cpp
# Opt level: O0

void __thiscall
sglr::GLContext::readPixels
          (GLContext *this,int x,int y,int width,int height,deUint32 format,deUint32 type,void *data
          )

{
  code *pcVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  MessageBuilder *pMVar5;
  undefined4 extraout_var;
  int *piVar6;
  Enum<int,_2UL> EVar7;
  undefined1 local_200 [8];
  IVec2 offset;
  Enum<int,_2UL> local_1e8;
  GetNameFunc local_1d8;
  int local_1d0;
  Enum<int,_2UL> local_1c8 [2];
  MessageBuilder local_1a8;
  deUint32 local_24;
  int local_20;
  deUint32 format_local;
  int height_local;
  int width_local;
  int y_local;
  int x_local;
  GLContext *this_local;
  
  local_24 = format;
  local_20 = height;
  format_local = width;
  height_local = y;
  width_local = x;
  _y_local = this;
  if ((this->m_logFlags & 1) != 0) {
    tcu::TestLog::operator<<(&local_1a8,this->m_log,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<(&local_1a8,(char (*) [14])"glReadPixels(");
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&width_local);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0xf95514);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&height_local);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0xf95514);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(int *)&format_local);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0xf95514);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_20);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0xf95514);
    EVar7 = glu::getTextureFormatStr(local_24);
    local_1d8 = EVar7.m_getName;
    local_1d0 = EVar7.m_value;
    local_1c8[0].m_getName = local_1d8;
    local_1c8[0].m_value = local_1d0;
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,local_1c8);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0xf95514);
    EVar7 = glu::getTypeStr(type);
    offset.m_data = (int  [2])EVar7.m_getName;
    local_1e8.m_value = EVar7.m_value;
    local_1e8.m_getName = (GetNameFunc)offset.m_data;
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_1e8);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0xf95514);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&data);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0xf2e642);
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1a8);
  }
  getReadOffset((GLContext *)local_200);
  iVar4 = (*this->m_context->_vptr_RenderContext[3])();
  iVar3 = width_local;
  pcVar1 = *(code **)(CONCAT44(extraout_var,iVar4) + 0x1220);
  piVar6 = tcu::Vector<int,_2>::x((Vector<int,_2> *)local_200);
  iVar2 = height_local;
  iVar4 = *piVar6;
  piVar6 = tcu::Vector<int,_2>::y((Vector<int,_2> *)local_200);
  (*pcVar1)(iVar3 + iVar4,iVar2 + *piVar6,format_local,local_20,local_24,type,data);
  return;
}

Assistant:

void GLContext::readPixels (int x, int y, int width, int height, deUint32 format, deUint32 type, void* data)
{
	// Don't log offset.
	if ((m_logFlags & GLCONTEXT_LOG_CALLS) != 0)
		m_log << TestLog::Message << "glReadPixels("
								  << x << ", " << y << ", " << width << ", " << height << ", "
								  << glu::getTextureFormatStr(format) << ", "
								  << glu::getTypeStr(type) << ", " << data << ")"
			  << TestLog::EndMessage;

	tcu::IVec2 offset = getReadOffset();
	m_context.getFunctions().readPixels(x+offset.x(), y+offset.y(), width, height, format, type, data);
}